

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

StringBuilder * __thiscall Potassco::StringBuilder::append_(StringBuilder *this,uint64_t n,bool pos)

{
  StringBuilder *pSVar1;
  byte in_DL;
  ulong in_RSI;
  char *in_RDI;
  StringBuilder *unaff_retaddr;
  uint32_t r;
  uint64_t q;
  uint32_t p;
  char temp [22];
  uint local_2c;
  char local_28 [23];
  byte local_11;
  
  local_11 = in_DL & 1;
  if (local_11 == 0) {
    in_RSI = (in_RSI ^ 0xffffffffffffffff) + 1;
  }
  local_2c = 0x15;
  for (; 9 < in_RSI; in_RSI = in_RSI / 10) {
    local_28[local_2c] = (char)(in_RSI % 10) + '0';
    local_2c = local_2c - 1;
  }
  local_28[local_2c] = (char)in_RSI + '0';
  if (local_11 == 0) {
    local_28[local_2c - 1] = '-';
  }
  pSVar1 = append(unaff_retaddr,in_RDI,in_RSI);
  return pSVar1;
}

Assistant:

StringBuilder& StringBuilder::append_(uint64_t n, bool pos) {
	char temp[22];
	if (!pos) { n = ~n + 1; }
	uint32_t p = static_cast<uint32_t>(sizeof(temp) - 1);
	while (n >= 10) {
		uint64_t const q = n / 10;
		uint32_t const r = static_cast<uint32_t>(n % 10);
		temp[p--] = static_cast<char>('0' + r);
		n = q;
	}
	temp[p] = static_cast<char>(static_cast<uint32_t>(n) + '0');
	if (!pos) { temp[--p] = '-'; }
	return append(temp + p, sizeof(temp) - p);
}